

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
MPSgetRHS<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,soplex *this,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *left,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *right)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  undefined8 *puVar10;
  long in_FS_OFFSET;
  cpp_dec_float<100U,_int,_void> local_88;
  double local_38;
  undefined8 uStack_30;
  
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 0x10;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[8] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[9] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[10] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xb] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xc] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xd] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xe] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xf] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x3d) = 0;
  ::soplex::infinity::__tls_init();
  local_38 = *(double *)(in_FS_OFFSET + -8);
  uStack_30 = 0;
  local_88.fpclass = cpp_dec_float_finite;
  local_88.prec_elem = 0x10;
  local_88.data._M_elems[0] = 0;
  local_88.data._M_elems[1] = 0;
  local_88.data._M_elems[2] = 0;
  local_88.data._M_elems[3] = 0;
  local_88.data._M_elems[4] = 0;
  local_88.data._M_elems[5] = 0;
  local_88.data._M_elems[6] = 0;
  local_88.data._M_elems[7] = 0;
  local_88.data._M_elems[8] = 0;
  local_88.data._M_elems[9] = 0;
  local_88.data._M_elems[10] = 0;
  local_88.data._M_elems[0xb] = 0;
  local_88.data._M_elems[0xc] = 0;
  local_88.data._M_elems[0xd] = 0;
  local_88.data._M_elems._56_5_ = 0;
  local_88.data._M_elems[0xf]._1_3_ = 0;
  local_88.exp = 0;
  local_88.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_88,-local_38);
  if (((*(int *)(this + 0x48) == 2) || (local_88.fpclass == cpp_dec_float_NaN)) ||
     (iVar9 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                        ((cpp_dec_float<100U,_int,_void> *)this,&local_88), iVar9 < 1)) {
    ::soplex::infinity::__tls_init();
    local_88.fpclass = cpp_dec_float_finite;
    local_88.prec_elem = 0x10;
    local_88.data._M_elems[0] = 0;
    local_88.data._M_elems[1] = 0;
    local_88.data._M_elems[2] = 0;
    local_88.data._M_elems[3] = 0;
    local_88.data._M_elems[4] = 0;
    local_88.data._M_elems[5] = 0;
    local_88.data._M_elems[6] = 0;
    local_88.data._M_elems[7] = 0;
    local_88.data._M_elems[8] = 0;
    local_88.data._M_elems[9] = 0;
    local_88.data._M_elems[10] = 0;
    local_88.data._M_elems[0xb] = 0;
    local_88.data._M_elems[0xc] = 0;
    local_88.data._M_elems[0xd] = 0;
    local_88.data._M_elems._56_5_ = 0;
    local_88.data._M_elems[0xf]._1_3_ = 0;
    local_88.exp = 0;
    local_88.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_88,local_38);
    if ((((left->m_backend).fpclass == cpp_dec_float_NaN) || (local_88.fpclass == cpp_dec_float_NaN)
        ) || (iVar9 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                (&left->m_backend,&local_88), this = (soplex *)left, -1 < iVar9)) {
      puVar10 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_88.data._M_elems._0_8_ = local_88.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"XMPSWR01 This should never happen.","");
      *puVar10 = &PTR__SPxException_0069d438;
      puVar10[1] = puVar10 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar10 + 1),local_88.data._M_elems._0_8_,
                 local_88.data._M_elems._0_8_ + local_88.data._M_elems._8_8_);
      *puVar10 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar10,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
  }
  uVar2 = *(undefined8 *)this;
  uVar3 = *(undefined8 *)(this + 8);
  uVar4 = *(undefined8 *)(this + 0x10);
  uVar5 = *(undefined8 *)(this + 0x18);
  uVar6 = *(undefined8 *)(this + 0x20);
  uVar7 = *(undefined8 *)(this + 0x28);
  uVar8 = *(undefined8 *)(this + 0x38);
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xc) =
       *(undefined8 *)(this + 0x30);
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xe) = uVar8;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) = uVar6;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 10) = uVar7;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) = uVar4;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) = uVar5;
  *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems = uVar2;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) = uVar3;
  (__return_storage_ptr__->m_backend).exp = *(int *)(this + 0x40);
  (__return_storage_ptr__->m_backend).neg = (bool)this[0x44];
  (__return_storage_ptr__->m_backend).fpclass = *(fpclass_type *)(this + 0x48);
  uVar1 = *(uint *)(this + 0x4c);
  (__return_storage_ptr__->m_backend).prec_elem = uVar1;
  return (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)(ulong)uVar1;
}

Assistant:

static R MPSgetRHS(R left, R right)
{
   R rhsval;

   if(left > R(-infinity))   /// This includes ranges
      rhsval = left;
   else if(right <  R(infinity))
      rhsval = right;
   else
      throw SPxInternalCodeException("XMPSWR01 This should never happen.");

   return rhsval;
}